

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

CAddr __thiscall
cppforth::Forth::virtualMemorySegmentInit(Forth *this,vmSegments segmentNum,Cell size)

{
  pointer pVVar1;
  pointer pVVar2;
  reference pvVar3;
  CAddr CVar4;
  allocator<char> local_51;
  VirtualMemorySegment variables;
  
  pVVar1 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pVVar2 - (long)pVVar1 >> 5 == (ulong)segmentNum) {
    if (pVVar2 == pVVar1) {
      CVar4 = 0;
    }
    else {
      pvVar3 = std::
               vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
               ::at(&this->VirtualMemory,(long)(int)(segmentNum - vmSegmentSourceBufferRefill));
      CVar4 = pvVar3->end + 1;
    }
    variables.start = CVar4;
    variables.end = CVar4 + size;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&variables.segment,(ulong)size,(allocator_type *)&local_51);
    std::
    vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
    ::push_back(&this->VirtualMemory,&variables);
    this->VirtualMemoryFreeSegment = CVar4 + size;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&variables.segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
    ;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&variables,"VirtualMemory init failure",&local_51);
    throwCppExceptionMessage(this,(string *)&variables,errorAllocate);
    std::__cxx11::string::~string((string *)&variables);
    CVar4 = 0;
  }
  return CVar4;
}

Assistant:

CAddr virtualMemorySegmentInit(vmSegments segmentNum, Cell size ){
			if (VirtualMemory.size() == segmentNum) {
				Cell start{},end{};
				start=(VirtualMemory.size()==0)?0:VirtualMemory.at(segmentNum-1).end+1;
				end=start+size;
				VirtualMemorySegment variables{ start, end, std::vector<Char>(end-start) };
				VirtualMemory.push_back(variables);
				VirtualMemoryFreeSegment = end;
				return start;
			} else {
				throwCppExceptionMessage("VirtualMemory init failure",errorAllocate);
			}
			assert("!Not reachable");
			return 0; // to avoid warning. this code in not reachable	
		}